

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExporter.cpp
# Opt level: O1

void __thiscall Assimp::STLExporter::WritePointCloud(STLExporter *this,string *name,aiScene *pScene)

{
  aiMesh *paVar1;
  aiVector3D *paVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"solid",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," facet normal ",0xe);
  poVar3 = std::ostream::_M_insert<double>(0.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::ostream::_M_insert<double>(0.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::ostream::_M_insert<double>(0.0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
  if (pScene->mNumMeshes != 0) {
    uVar4 = 0;
    do {
      paVar1 = pScene->mMeshes[uVar4];
      if ((paVar1 != (aiMesh *)0x0) && (paVar1->mNumVertices != 0)) {
        lVar6 = 8;
        uVar5 = 0;
        do {
          paVar2 = paVar1->mVertices;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"  vertex ",9);
          poVar3 = std::ostream::_M_insert<double>((double)*(float *)((long)paVar2 + lVar6 + -8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          poVar3 = std::ostream::_M_insert<double>((double)*(float *)((long)paVar2 + lVar6 + -4));
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          poVar3 = std::ostream::_M_insert<double>((double)*(float *)((long)&paVar2->x + lVar6));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"  vertex ",9);
          poVar3 = std::ostream::_M_insert<double>((double)*(float *)((long)paVar2 + lVar6 + -8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          poVar3 = std::ostream::_M_insert<double>((double)*(float *)((long)paVar2 + lVar6 + -4));
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          poVar3 = std::ostream::_M_insert<double>((double)*(float *)((long)&paVar2->x + lVar6));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"  vertex ",9);
          poVar3 = std::ostream::_M_insert<double>((double)*(float *)((long)paVar2 + lVar6 + -8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          poVar3 = std::ostream::_M_insert<double>((double)*(float *)((long)paVar2 + lVar6 + -4));
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
          poVar3 = std::ostream::_M_insert<double>((double)*(float *)((long)&paVar2->x + lVar6));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar3,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
          uVar5 = uVar5 + 1;
          lVar6 = lVar6 + 0xc;
        } while (uVar5 < paVar1->mNumVertices);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < pScene->mNumMeshes);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"endsolid",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)this,(name->_M_dataplus)._M_p,name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,(this->endl)._M_dataplus._M_p,(this->endl)._M_string_length);
  return;
}

Assistant:

void STLExporter::WritePointCloud(const std::string &name, const aiScene* pScene) {
    mOutput << " " << SolidToken << " " << name << endl;
    aiVector3D nor;
    mOutput << " facet normal " << nor.x << " " << nor.y << " " << nor.z << endl;
    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
        aiMesh *mesh = pScene->mMeshes[i];
        if (nullptr == mesh) {
            continue;
        }

        for (unsigned int a = 0; a < mesh->mNumVertices; ++a) {
            const aiVector3D& v = mesh->mVertices[a];
            mOutput << "  vertex " << v.x << " " << v.y << " " << v.z << endl;
            mOutput << "  vertex " << v.x << " " << v.y << " " << v.z << endl;
            mOutput << "  vertex " << v.x << " " << v.y << " " << v.z << endl;
        }
    }
    mOutput << EndSolidToken << " " << name << endl;
}